

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_decimalquantity.cpp
# Opt level: O0

DecimalQuantity * __thiscall
icu_63::number::impl::DecimalQuantity::setToDecNumber
          (DecimalQuantity *this,StringPiece n,UErrorCode *status)

{
  StringPiece str;
  undefined1 local_88 [8];
  DecNum decnum;
  UErrorCode *status_local;
  DecimalQuantity *this_local;
  StringPiece n_local;
  
  decnum._88_8_ = status;
  setBcdToZero(this);
  this->flags = '\0';
  DecNum::DecNum((DecNum *)local_88);
  str._12_4_ = 0;
  str.ptr_ = (char *)SUB128(n._0_12_,0);
  str.length_ = SUB124(n._0_12_,8);
  DecNum::setTo((DecNum *)local_88,str,(UErrorCode *)decnum._88_8_);
  _setToDecNum(this,(DecNum *)local_88,(UErrorCode *)decnum._88_8_);
  DecNum::~DecNum((DecNum *)local_88);
  return this;
}

Assistant:

DecimalQuantity &DecimalQuantity::setToDecNumber(StringPiece n, UErrorCode& status) {
    setBcdToZero();
    flags = 0;

    // Compute the decNumber representation
    DecNum decnum;
    decnum.setTo(n, status);

    _setToDecNum(decnum, status);
    return *this;
}